

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O1

void __thiscall
FIX::SessionSettings::set(SessionSettings *this,SessionID *sessionID,Dictionary *settings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  ConfigError *this_00;
  SessionSettings *this_01;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar3 = std::
          _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
          ::find((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                  *)this,sessionID);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_settings)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BeginString","");
    Dictionary::setString
              (settings,&local_68,
               &(sessionID->m_beginString).super_StringField.super_FieldBase.m_string);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"SenderCompID","");
    Dictionary::setString
              (settings,&local_68,
               &(sessionID->m_senderCompID).super_StringField.super_FieldBase.m_string);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TargetCompID","");
    Dictionary::setString
              (settings,&local_68,
               &(sessionID->m_targetCompID).super_StringField.super_FieldBase.m_string);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    this_01 = (SessionSettings *)settings;
    Dictionary::merge(settings,&this->m_defaults);
    validate(this_01,settings);
    pmVar4 = std::
             map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
             ::operator[](&this->m_settings,sessionID);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&(pmVar4->m_data)._M_t,&(settings->m_data)._M_t);
    std::__cxx11::string::_M_assign((string *)&pmVar4->m_name);
    return;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar2 = (sessionID->m_frozenString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (sessionID->m_frozenString)._M_string_length);
  std::operator+(&local_68,"Duplicate Session ",&local_48);
  ConfigError::ConfigError(this_00,&local_68);
  __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  if (has(sessionID)) {
    throw ConfigError("Duplicate Session " + sessionID.toString());
  }

  settings.setString(BEGINSTRING, sessionID.getBeginString());
  settings.setString(SENDERCOMPID, sessionID.getSenderCompID());
  settings.setString(TARGETCOMPID, sessionID.getTargetCompID());

  settings.merge(m_defaults);
  validate(settings);
  m_settings[sessionID] = settings;
}